

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortBackref * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueSymbol::PortBackref,slang::ast::PortSymbol_const&,slang::ast::ValueSymbol::PortBackref_const*&>
          (BumpAllocator *this,PortSymbol *args,PortBackref **args_1)

{
  PortBackref *next;
  PortSymbol *in_RDX;
  PortBackref *in_RSI;
  BumpAllocator *in_RDI;
  
  next = (PortBackref *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::ValueSymbol::PortBackref::PortBackref(in_RSI,in_RDX,next);
  return next;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }